

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall QDirListingPrivate::pushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  _Head_base<0UL,_QAbstractFileEngine_*,_false> _Var1;
  bool bVar2;
  QSharedDataPointer<QFileInfoPrivate> *this_00;
  QFileInfoPrivate *pQVar3;
  long in_FS_OFFSET;
  QFileSystemEntry local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_60.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QDirEntryInfo::filePath((QString *)&local_60.m_nativeFilePath,entryInfo);
  if (((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
       super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x800) != 0) {
    QDirEntryInfo::canonicalFilePath(&local_60.m_filePath,entryInfo);
    bVar2 = QDuplicateTracker<QString,_32UL>::hasSeen(&this->visitedLinks,&local_60.m_filePath);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
    if (bVar2) goto LAB_00219e38;
  }
  _Var1._M_head_impl =
       (this->engine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (QAbstractFileEngine *)0x0) {
    if ((entryInfo->fileInfoOpt).super__Optional_base<QFileInfo,_false,_false>._M_payload.
        super__Optional_payload<QFileInfo,_true,_false,_false>.
        super__Optional_payload_base<QFileInfo>._M_engaged == true) {
      this_00 = &std::_Optional_base_impl<QFileInfo,_std::_Optional_base<QFileInfo,_false,_false>_>
                 ::_M_get((_Optional_base_impl<QFileInfo,_std::_Optional_base<QFileInfo,_false,_false>_>
                           *)&entryInfo->fileInfoOpt)->d_ptr;
      pQVar3 = QSharedDataPointer<QFileInfoPrivate>::operator->(this_00);
      entryInfo = (QDirEntryInfo *)&pQVar3->fileEntry;
    }
    std::make_unique<QFileSystemIterator,QFileSystemEntry&,QFlags<QDirListing::IteratorFlag>&>
              (&local_60,(QFlags<QDirListing::IteratorFlag> *)entryInfo);
    std::
    vector<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>,std::allocator<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>>
    ::emplace_back<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>
              ((vector<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>,std::allocator<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>>
                *)&this->nativeIterators,
               (unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
               &local_60);
    std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::~unique_ptr
              ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
               &local_60);
  }
  else {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QAbstractFileEngine + 0xf0))
              (_Var1._M_head_impl,&local_60.m_nativeFilePath);
    local_60.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    _Var1._M_head_impl =
         (this->engine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QAbstractFileEngine + 0x110))
              (&local_60,_Var1._M_head_impl,&local_60.m_nativeFilePath,
               (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
               super_QFlagsStorage<QDirListing::IteratorFlag>.i,&this->nameFilters);
    if (local_60.m_filePath.d.d != (Data *)0x0) {
      std::
      vector<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>,std::allocator<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>>
      ::
      emplace_back<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>
                ((vector<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>,std::allocator<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>>
                  *)&this->fileEngineIterators,
                 (unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                  *)&local_60);
      if (local_60.m_filePath.d.d != (Data *)0x0) {
        (**(code **)(*(long *)&(local_60.m_filePath.d.d)->super_QArrayData + 8))();
      }
    }
  }
LAB_00219e38:
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&local_60.m_nativeFilePath);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::pushDirectory(QDirEntryInfo &entryInfo)
{
    const QString path = [&entryInfo] {
#ifdef Q_OS_WIN
        if (entryInfo.isSymLink())
            return entryInfo.canonicalFilePath();
#endif
        return entryInfo.filePath();
    }();


    if (iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::FollowDirSymlinks)) {
        // Stop link loops
        if (visitedLinks.hasSeen(entryInfo.canonicalFilePath()))
            return;
    }

    if (engine) {
        engine->setFileName(path);
        if (auto it = engine->beginEntryList(path, iteratorFlags, nameFilters)) {
            fileEngineIterators.emplace_back(std::move(it));
        } else {
            // No iterator; no entry list.
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QFileSystemEntry *fentry = nullptr;
        if (entryInfo.fileInfoOpt)
            fentry = &entryInfo.fileInfoOpt->d_ptr->fileEntry;
        else
            fentry = &entryInfo.entry;
        nativeIterators.emplace_back(std::make_unique<QFileSystemIterator>(*fentry, iteratorFlags));
#else
        qWarning("Qt was built with -no-feature-filesystemiterator: no files/plugins will be found!");
#endif
    }
}